

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

BrailleCanvas * __thiscall plot::BrailleCanvas::pop(BrailleCanvas *this,TerminalOp op)

{
  bool bVar1;
  reference this_00;
  vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_> *__x;
  iterator local_38;
  const_iterator local_30;
  iterator local_28;
  const_iterator local_20;
  TerminalOp local_14;
  BrailleCanvas *pBStack_10;
  TerminalOp op_local;
  BrailleCanvas *this_local;
  
  local_14 = op;
  pBStack_10 = this;
  bVar1 = std::
          forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
          ::empty(&this->stack_);
  if (!bVar1) {
    this_00 = std::
              forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
              ::front(&this->stack_);
    detail::braille::image_t::paint(this_00,&this->blocks_,local_14);
    __x = &std::
           forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
           ::front(&this->stack_)->
           super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
    ;
    std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>::
    swap(&(this->blocks_).
          super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         ,__x);
    local_28._M_node =
         (_Fwd_list_node_base *)
         std::
         forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
         ::before_begin(&this->available_layers_);
    std::_Fwd_list_const_iterator<plot::detail::braille::image_t>::_Fwd_list_const_iterator
              (&local_20,&local_28);
    local_38._M_node =
         (_Fwd_list_node_base *)
         std::
         forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
         ::before_begin(&this->stack_);
    std::_Fwd_list_const_iterator<plot::detail::braille::image_t>::_Fwd_list_const_iterator
              (&local_30,&local_38);
    std::
    forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>::
    splice_after(&this->available_layers_,local_20,&this->stack_,local_30);
  }
  return this;
}

Assistant:

BrailleCanvas& pop(TerminalOp op = TerminalOp::Over) {
        if (!stack_.empty()) {
            stack_.front().paint(blocks_, op);
            blocks_.swap(stack_.front());
            available_layers_.splice_after(available_layers_.before_begin(), stack_, stack_.before_begin());
        }
        return *this;
    }